

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O2

deBool writeEscaped(qpXmlWriter *writer,char *str)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  char *__dest;
  char *__src;
  char buf [266];
  char local_148 [280];
  
  __dest = local_148;
  do {
    bVar1 = true;
    __src = "&lt;";
    switch(*str) {
    case '\0':
      bVar1 = false;
    default:
      *__dest = *str;
      __dest = __dest + 1;
      goto LAB_0095ae54;
    case '\x01':
      __src = "&lt;SOH&gt;";
      break;
    case '\x02':
      __src = "&lt;STX&gt;";
      break;
    case '\x03':
      __src = "&lt;ETX&gt;";
      break;
    case '\x04':
      __src = "&lt;EOT&gt;";
      break;
    case '\x05':
      __src = "&lt;ENQ&gt;";
      break;
    case '\x06':
      __src = "&lt;ACK&gt;";
      break;
    case '\a':
      __src = "&lt;BEL&gt;";
      break;
    case '\b':
      __src = "&lt;BS&gt;";
      break;
    case '\v':
      __src = "&lt;VT&gt;";
      break;
    case '\f':
      __src = "&lt;FF&gt;";
      break;
    case '\x0e':
      __src = "&lt;SO&gt;";
      break;
    case '\x0f':
      __src = "&lt;SI&gt;";
      break;
    case '\x10':
      __src = "&lt;DLE&gt;";
      break;
    case '\x11':
      __src = "&lt;DC1&gt;";
      break;
    case '\x12':
      __src = "&lt;DC2&gt;";
      break;
    case '\x13':
      __src = "&lt;DC3&gt;";
      break;
    case '\x14':
      __src = "&lt;DC4&gt;";
      break;
    case '\x15':
      __src = "&lt;NAK&gt;";
      break;
    case '\x16':
      __src = "&lt;SYN&gt;";
      break;
    case '\x17':
      __src = "&lt;ETB&gt;";
      break;
    case '\x18':
      __src = "&lt;CAN&gt;";
      break;
    case '\x19':
      __src = "&lt;EM&gt;";
      break;
    case '\x1a':
      __src = "&lt;SUB&gt;";
      break;
    case '\x1b':
      __src = "&lt;ESC&gt;";
      break;
    case '\x1c':
      __src = "&lt;FS&gt;";
      break;
    case '\x1d':
      __src = "&lt;GS&gt;";
      break;
    case '\x1e':
      __src = "&lt;RS&gt;";
      break;
    case '\x1f':
      __src = "&lt;US&gt;";
      break;
    case '\"':
      __src = "&quot;";
      break;
    case '&':
      __src = "&amp;";
      break;
    case '\'':
      __src = "&apos;";
      break;
    case '<':
      break;
    case '>':
      __src = "&gt;";
    }
    strcpy(__dest,__src);
    sVar3 = strlen(__src);
    __dest = __dest + sVar3;
    bVar1 = true;
LAB_0095ae54:
    if ((!bVar1) || (3 < (long)__dest - (long)local_148)) {
      *__dest = '\0';
      fputs(local_148,(FILE *)writer->outputFile);
      __dest = local_148;
    }
    str = str + 1;
    if (!bVar1) {
      if (writer->flushAfterWrite != 0) {
        uVar2 = fflush((FILE *)writer->outputFile);
        writer = (qpXmlWriter *)(ulong)uVar2;
      }
      return (deBool)writer;
    }
  } while( true );
}

Assistant:

static deBool writeEscaped (qpXmlWriter* writer, const char* str)
{
	char		buf[256 + 10];
	char*		d		= &buf[0];
	const char*	s		= str;
	deBool		isEOS	= DE_FALSE;

	do
	{
		/* Check for characters that need to be escaped. */
		const char* repl = DE_NULL;
		switch (*s)
		{
			case 0:		isEOS = DE_TRUE;		break;
			case '<':	repl = "&lt;";			break;
			case '>':	repl = "&gt;";			break;
			case '&':	repl = "&amp;";			break;
			case '\'':	repl = "&apos;";		break;
			case '"':	repl = "&quot;";		break;

			/* Non-printable characters. */
			case 1:		repl = "&lt;SOH&gt;";	break;
			case 2:		repl = "&lt;STX&gt;";	break;
			case 3:		repl = "&lt;ETX&gt;";	break;
			case 4:		repl = "&lt;EOT&gt;";	break;
			case 5:		repl = "&lt;ENQ&gt;";	break;
			case 6:		repl = "&lt;ACK&gt;";	break;
			case 7:		repl = "&lt;BEL&gt;";	break;
			case 8:		repl = "&lt;BS&gt;";	break;
			case 11:	repl = "&lt;VT&gt;";	break;
			case 12:	repl = "&lt;FF&gt;";	break;
			case 14:	repl = "&lt;SO&gt;";	break;
			case 15:	repl = "&lt;SI&gt;";	break;
			case 16:	repl = "&lt;DLE&gt;";	break;
			case 17:	repl = "&lt;DC1&gt;";	break;
			case 18:	repl = "&lt;DC2&gt;";	break;
			case 19:	repl = "&lt;DC3&gt;";	break;
			case 20:	repl = "&lt;DC4&gt;";	break;
			case 21:	repl = "&lt;NAK&gt;";	break;
			case 22:	repl = "&lt;SYN&gt;";	break;
			case 23:	repl = "&lt;ETB&gt;";	break;
			case 24:	repl = "&lt;CAN&gt;";	break;
			case 25:	repl = "&lt;EM&gt;";	break;
			case 26:	repl = "&lt;SUB&gt;";	break;
			case 27:	repl = "&lt;ESC&gt;";	break;
			case 28:	repl = "&lt;FS&gt;";	break;
			case 29:	repl = "&lt;GS&gt;";	break;
			case 30:	repl = "&lt;RS&gt;";	break;
			case 31:	repl = "&lt;US&gt;";	break;

			default:	/* nada */				break;
		}

		/* Write out char or escape sequence. */
		if (repl)
		{
			s++;
			strcpy(d, repl);
			d += strlen(repl);
		}
		else
			*d++ = *s++;

		/* Write buffer if EOS or buffer full. */
		if (isEOS || ((d - &buf[0]) >= 4))
		{
			*d = 0;
			fprintf(writer->outputFile, "%s", buf);
			d = &buf[0];
		}
	} while (!isEOS);

	if (writer->flushAfterWrite)
		fflush(writer->outputFile);
	DE_ASSERT(d == &buf[0]); /* buffer must be empty */
	return DE_TRUE;
}